

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
SignedBytesEqualFailure::SignedBytesEqualFailure
          (SignedBytesEqualFailure *this,UtestShell *test,char *fileName,int lineNumber,
          char expected,char actual,SimpleString *text)

{
  undefined4 in_ECX;
  SimpleString *in_RDX;
  SimpleString *in_RSI;
  TestFailure *in_RDI;
  undefined4 in_R8D;
  SimpleString expectedReported;
  SimpleString actualReported;
  SimpleString eHex;
  SimpleString eDecimal;
  SimpleString aHex;
  SimpleString aDecimal;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  SimpleString *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  char in_stack_ffffffffffffff7f;
  char in_stack_ffffffffffffff87;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  SimpleString *in_stack_ffffffffffffff90;
  UtestShell *in_stack_ffffffffffffff98;
  TestFailure *in_stack_ffffffffffffffa0;
  
  TestFailure::TestFailure
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff8c);
  in_RDI->_vptr_TestFailure = (_func_int **)&PTR__SignedBytesEqualFailure_0025dca0;
  TestFailure::createUserText
            ((TestFailure *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70);
  SimpleString::operator=
            ((SimpleString *)CONCAT44(in_ECX,in_R8D),
             (SimpleString *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  SimpleString::~SimpleString((SimpleString *)0x212223);
  StringFrom(in_stack_ffffffffffffff4c);
  HexStringFrom(in_stack_ffffffffffffff7f);
  StringFrom(in_stack_ffffffffffffff4c);
  HexStringFrom(in_stack_ffffffffffffff7f);
  SimpleString::padStringsToSameLength
            (in_stack_ffffffffffffff90,
             (SimpleString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             in_stack_ffffffffffffff87);
  SimpleString::padStringsToSameLength
            (in_stack_ffffffffffffff90,
             (SimpleString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             in_stack_ffffffffffffff87);
  SimpleString::SimpleString
            ((SimpleString *)CONCAT44(in_ECX,in_R8D),
             (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  SimpleString::operator+
            ((SimpleString *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70);
  SimpleString::operator+
            ((SimpleString *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70);
  SimpleString::~SimpleString((SimpleString *)0x2122e8);
  SimpleString::~SimpleString((SimpleString *)0x2122f2);
  SimpleString::SimpleString
            ((SimpleString *)CONCAT44(in_ECX,in_R8D),
             (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  SimpleString::operator+
            ((SimpleString *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70);
  SimpleString::operator+
            ((SimpleString *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70);
  SimpleString::~SimpleString((SimpleString *)0x21233b);
  SimpleString::~SimpleString((SimpleString *)0x212345);
  TestFailure::createButWasString(in_RDI,in_RSI,in_RDX);
  SimpleString::operator+=
            ((SimpleString *)CONCAT44(in_ECX,in_R8D),
             (SimpleString *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  SimpleString::~SimpleString((SimpleString *)0x21237f);
  SimpleString::~SimpleString((SimpleString *)0x212389);
  SimpleString::~SimpleString((SimpleString *)0x212393);
  SimpleString::~SimpleString((SimpleString *)0x21239d);
  SimpleString::~SimpleString((SimpleString *)0x2123a7);
  SimpleString::~SimpleString((SimpleString *)0x2123b1);
  SimpleString::~SimpleString((SimpleString *)0x2123bb);
  return;
}

Assistant:

SignedBytesEqualFailure::SignedBytesEqualFailure (UtestShell* test, const char* fileName, int lineNumber, signed char expected, signed char actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    SimpleString aDecimal = StringFrom((int)actual);
    SimpleString aHex = HexStringFrom(actual);
    SimpleString eDecimal = StringFrom((int)expected);
    SimpleString eHex = HexStringFrom(expected);

    SimpleString::padStringsToSameLength(aDecimal, eDecimal, ' ');
    SimpleString::padStringsToSameLength(aHex, eHex, '0');

    SimpleString actualReported = aDecimal + " 0x" + aHex;
    SimpleString expectedReported = eDecimal + " 0x" + eHex;
    message_ += createButWasString(expectedReported, actualReported);
}